

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::filename_enumerator(ImgfsFile *this,namefn *fn)

{
  bool bVar1;
  reference __args;
  _Self local_28;
  _Self local_20;
  iterator i;
  namefn *fn_local;
  ImgfsFile *this_local;
  
  i._M_node = (_Base_ptr)fn;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>_>_>
       ::begin(&this->_files);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>_>_>
         ::end(&this->_files);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    __args = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>_>
             ::operator*(&local_20);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(fn,&__args->first);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>_>
    ::operator++(&local_20,0);
  }
  return;
}

Assistant:

virtual void filename_enumerator(namefn fn)
    {
        for (auto i=_files.begin() ; i!=_files.end() ; i++)
        {
            fn((*i).first);
        }
    }